

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=
          (string<unsigned_short> *this,string<unsigned_short> *other)

{
  undefined1 auVar1 [16];
  s32 sVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  int local_2c;
  unsigned_short *puStack_28;
  s32 i;
  unsigned_short *p;
  string<unsigned_short> *other_local;
  string<unsigned_short> *this_local;
  
  if (this != other) {
    if (this->array != (unsigned_short *)0x0) {
      operator_delete__(this->array);
    }
    sVar2 = size(other);
    this->used = sVar2 + 1;
    this->allocated = sVar2 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->used;
    uVar3 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    puVar4 = (unsigned_short *)operator_new__(uVar3);
    this->array = puVar4;
    puStack_28 = c_str(other);
    for (local_2c = 0; local_2c < this->used; local_2c = local_2c + 1) {
      this->array[local_2c] = *puStack_28;
      puStack_28 = puStack_28 + 1;
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}